

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void sync_write(AV1LfSync *lf_sync,int r,int c,int sb_cols,int plane)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int sig;
  int cur;
  int nsync;
  int local_28;
  int local_20;
  
  bVar1 = in_ECX + -1 <= in_EDX;
  local_20 = in_EDX;
  if (bVar1) {
    local_20 = in_ECX + *(int *)(in_RDI + 0x48);
  }
  if (bVar1 || in_EDX % *(int *)(in_RDI + 0x48) == 0) {
    pthread_mutex_lock((pthread_mutex_t *)
                       (*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
    if (local_20 < *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4)) {
      local_28 = *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4);
    }
    else {
      local_28 = local_20;
    }
    *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4) = local_28;
    pthread_cond_broadcast
              ((pthread_cond_t *)(*(long *)(in_RDI + 0x18 + (long)in_R8D * 8) + (long)in_ESI * 0x30)
              );
    pthread_mutex_unlock
              ((pthread_mutex_t *)(*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
  }
  return;
}

Assistant:

static inline void sync_write(AV1LfSync *const lf_sync, int r, int c,
                              const int sb_cols, int plane) {
#if CONFIG_MULTITHREAD
  const int nsync = lf_sync->sync_range;
  int cur;
  // Only signal when there are enough filtered SB for next row to run.
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync;
  }

  if (sig) {
    pthread_mutex_lock(&lf_sync->mutex_[plane][r]);

    // When a thread encounters an error, cur_sb_col[plane][r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // cur_sb_col[plane][r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    lf_sync->cur_sb_col[plane][r] = AOMMAX(lf_sync->cur_sb_col[plane][r], cur);

    pthread_cond_broadcast(&lf_sync->cond_[plane][r]);
    pthread_mutex_unlock(&lf_sync->mutex_[plane][r]);
  }
#else
  (void)lf_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}